

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O3

void __thiscall
ON_PolylineCurve::ON_PolylineCurve
          (ON_PolylineCurve *this,ON_3dPointArray *points,ON_SimpleArray<double> *params)

{
  uint uVar1;
  ulong uVar2;
  
  ON_Curve::ON_Curve(&this->super_ON_Curve);
  (this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_008181c0;
  ON_Polyline::ON_Polyline(&this->m_pline);
  (this->m_t)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080a228;
  (this->m_t).m_a = (double *)0x0;
  (this->m_t).m_count = 0;
  (this->m_t).m_capacity = 0;
  operator=(this,points);
  uVar1 = (points->super_ON_SimpleArray<ON_3dPoint>).m_count;
  if (uVar1 == params->m_count) {
    if (1 < (int)uVar1) {
      uVar2 = 1;
      do {
        if (params->m_a[uVar2] <= params->m_a[uVar2 - 1]) {
          return;
        }
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
    ON_SimpleArray<double>::operator=(&this->m_t,params);
  }
  return;
}

Assistant:

ON_PolylineCurve::ON_PolylineCurve(const ON_3dPointArray& points, const ON_SimpleArray<double>& params)
{
  *this = points;
  if (points.Count() == params.Count())
  {
    for (int i = 1; i < params.Count(); i++)
    {
      if (params[i-1] >= params[i])
        return;
    }
    m_t = params;
  }
}